

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

ostream * AixLog::operator<<(ostream *os,Tag *tag)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  ostream *poVar4;
  
  poVar2 = (ostream *)&std::clog;
  if (*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0) {
    poVar4 = (ostream *)0x0;
  }
  else {
    poVar2 = (ostream *)
             __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                     *(long *)(std::clog + -0x18)),&std::streambuf::typeinfo,
                            &Log::typeinfo,0);
    poVar4 = poVar2;
  }
  if (poVar4 != (ostream *)0x0) {
    __mutex = (pthread_mutex_t *)(poVar4 + 0x148);
    iVar1 = pthread_mutex_lock(__mutex);
    if (iVar1 == 0) {
      std::__cxx11::string::_M_assign((string *)(poVar4 + 0x90));
      poVar4[0xb0] = os[0x28];
      iVar1 = pthread_mutex_unlock(__mutex);
      return (ostream *)CONCAT44(extraout_var,iVar1);
    }
    uVar3 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock(__mutex);
    _Unwind_Resume(uVar3);
  }
  if (os[0x28] != (ostream)0x0) {
    return poVar2;
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::clog,*(char **)(os + 8),*(long *)(os + 0x10));
  return poVar2;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Tag& tag) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.tag = tag;
  } else if (tag) {
    os << tag.text;
  }
  return os;
}